

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib526.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  CURL *pCVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  int ec_7;
  CURLMcode ec_6;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_5;
  int local_214;
  CURLMcode ec_4;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_68;
  int local_60;
  int local_5c;
  int i;
  int current;
  CURLM *m;
  undefined8 uStack_48;
  int running;
  CURL *curl [4];
  int local_1c;
  int res;
  char *URL_local;
  
  local_1c = 0;
  _i = 0;
  local_5c = 0;
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    curl[(long)local_60 + -1] = (CURL *)0x0;
  }
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_68 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_68;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                  ,0x43,iVar2,uVar3);
    local_1c = iVar2;
  }
  if (local_1c == 0) {
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      pCVar4 = (CURL *)curl_easy_init();
      curl[(long)local_60 + -1] = pCVar4;
      if (pCVar4 == (CURL *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                      ,0x47);
        local_1c = 0x7c;
      }
      if (local_1c != 0) goto LAB_00102afb;
      iVar2 = curl_easy_setopt(curl[(long)local_60 + -1],0x2712,URL);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                      ,0x49,iVar2,uVar3);
        local_1c = iVar2;
      }
      if (local_1c != 0) goto LAB_00102afb;
      iVar2 = curl_easy_setopt(curl[(long)local_60 + -1],0x29,1);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                      ,0x4b,iVar2,uVar3);
        local_1c = iVar2;
      }
      if (local_1c != 0) goto LAB_00102afb;
    }
    _i = curl_multi_init();
    if (_i == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                    ,0x4e);
      local_1c = 0x7b;
    }
    if (local_1c == 0) {
      iVar2 = curl_multi_add_handle(_i,uStack_48);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                      ,0x50,iVar2,uVar3);
        local_1c = iVar2;
      }
      if (local_1c == 0) {
        curl_mfprintf(_stderr,"Start at URL 0\n");
        do {
          local_214 = -99;
          rd.__fds_bits[0xf] = 1;
          iVar2 = curl_multi_perform(_i,(long)&m + 4);
          uVar1 = _stderr;
          if (iVar2 == 0) {
            if (m._4_4_ < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                            ,0x5c,m._4_4_);
              local_1c = 0x7a;
            }
          }
          else {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                          ,0x5c,iVar2,uVar3);
            local_1c = iVar2;
          }
          if (local_1c != 0) break;
          tVar8 = tutil_tvnow();
          older.tv_usec = tv_test_start.tv_usec;
          older.tv_sec = tv_test_start.tv_sec;
          lVar5 = tutil_tvdiff(tVar8,older);
          if (60000 < lVar5) {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                          ,0x5e);
            local_1c = 0x7d;
          }
          if (local_1c != 0) break;
          if (m._4_4_ == 0) {
            curl_easy_cleanup(curl[(long)local_5c + -1]);
            curl[(long)local_5c + -1] = (CURL *)0x0;
            local_5c = local_5c + 1;
            if (3 < local_5c) break;
            curl_mfprintf(_stderr,"Advancing to URL %d\n",local_5c);
            iVar2 = curl_multi_add_handle(_i,curl[(long)local_5c + -1]);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                            ,0x78,iVar2,uVar3);
              local_1c = iVar2;
            }
            if (local_1c != 0) break;
          }
          for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
            wr.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            (&ec_4 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
            (&ec_4 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
          }
          iVar2 = curl_multi_fdset(_i,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,&ec_4,&local_214);
          uVar1 = _stderr;
          if (iVar2 == 0) {
            if (local_214 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                            ,0x84,local_214);
              local_1c = 0x7a;
            }
          }
          else {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                          ,0x84,iVar2,uVar3);
            local_1c = iVar2;
          }
          if (local_1c != 0) break;
          iVar2 = select_wrapper(local_214 + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                 (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_4,
                                 (timeval *)(rd.__fds_bits + 0xf));
          if (iVar2 == -1) {
            piVar6 = __errno_location();
            uVar1 = _stderr;
            iVar2 = *piVar6;
            pcVar7 = strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                          ,0x88,iVar2,pcVar7);
            local_1c = 0x79;
          }
          if (local_1c != 0) break;
          tVar8 = tutil_tvnow();
          older_00.tv_usec = tv_test_start.tv_usec;
          older_00.tv_sec = tv_test_start.tv_sec;
          lVar5 = tutil_tvdiff(tVar8,older_00);
          if (60000 < lVar5) {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib526.c"
                          ,0x8a);
            local_1c = 0x7d;
          }
        } while (local_1c == 0);
      }
    }
LAB_00102afb:
    if (local_1c != 0) {
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        curl_easy_cleanup(curl[(long)local_60 + -1]);
      }
    }
    curl_multi_cleanup(_i);
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    URL_local._4_4_ = local_1c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int current = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    easy_init(curl[i]);
    /* specify target */
    easy_setopt(curl[i], CURLOPT_URL, URL);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
  }

  multi_init(m);

  multi_add_handle(m, curl[current]);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
#ifdef LIB527
      /* NOTE: this code does not remove the handle from the multi handle
         here, which would be the nice, sane and documented way of working.
         This however tests that the API survives this abuse gracefully. */
      curl_easy_cleanup(curl[current]);
      curl[current] = NULL;
#endif
      if(++current < NUM_HANDLES) {
        fprintf(stderr, "Advancing to URL %d\n", current);
#ifdef LIB532
        /* first remove the only handle we use */
        curl_multi_remove_handle(m, curl[0]);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl[0]);
        easy_setopt(curl[0], CURLOPT_URL, URL);
        /* go verbose */
        easy_setopt(curl[0], CURLOPT_VERBOSE, 1L);

        /* re-add it */
        multi_add_handle(m, curl[0]);
#else
        multi_add_handle(m, curl[current]);
#endif
      }
      else {
        break; /* done */
      }
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#if defined(LIB526)

  /* test 526 and 528 */
  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB527)

  /* test 527 */

  /* Upon non-failure test flow the easy's have already been cleanup'ed. In
     case there is a failure we arrive here with easy's that have not been
     cleanup'ed yet, in this case we have to cleanup them or otherwise these
     will be leaked, let's use undocumented cleanup sequence - type UB */

  if(res)
    for(i = 0; i < NUM_HANDLES; i++)
      curl_easy_cleanup(curl[i]);

  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB532)

  /* test 532 */
  /* undocumented cleanup sequence - type UB */

  for(i = 0; i < NUM_HANDLES; i++)
    curl_easy_cleanup(curl[i]);
  curl_multi_cleanup(m);
  curl_global_cleanup();

#endif

  return res;
}